

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_adefda::HandleSublistCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  undefined8 uVar1;
  cmExecutionStatus *pcVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  cmMakefile *pcVar6;
  cmList *pcVar7;
  size_type sVar8;
  out_of_range *e;
  string_view local_158;
  undefined1 local_148 [8];
  cmList sublist;
  unsigned_long local_110;
  string local_108;
  string local_e8;
  string local_c8;
  int local_a4;
  int local_a0;
  int length;
  int start;
  undefined1 local_88 [8];
  optional<cmList> list;
  string *variableName;
  string *listName;
  unsigned_long local_48;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar2 = local_20;
  if (sVar4 != 5) {
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
    local_48 = sVar4 - 1;
    cmStrCat<char_const(&)[46],unsigned_long,char_const(&)[9]>
              (&local_40,(char (*) [46])"sub-command SUBLIST requires four arguments (",&local_48,
               (char (*) [9])" found).");
    cmExecutionStatus::SetError(pcVar2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    args_local._7_1_ = 0;
    goto LAB_0062f077;
  }
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,1);
  list.super__Optional_base<cmList,_false,_false>._M_payload.
  super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>._24_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)status_local);
  pcVar6 = cmExecutionStatus::GetMakefile(local_20);
  GetList((optional<cmList> *)local_88,pvVar5,pcVar6);
  bVar3 = std::optional::operator_cast_to_bool((optional *)local_88);
  if (bVar3) {
    pcVar7 = std::optional<cmList>::operator->((optional<cmList> *)local_88);
    bVar3 = cmList::empty(pcVar7);
    if (bVar3) goto LAB_0062eb1c;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,2);
    pcVar6 = cmExecutionStatus::GetMakefile(local_20);
    bVar3 = GetIndexArg(pvVar5,&local_a0,pcVar6);
    pcVar2 = local_20;
    if (bVar3) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,3);
      pcVar6 = cmExecutionStatus::GetMakefile(local_20);
      bVar3 = GetIndexArg(pvVar5,&local_a4,pcVar6);
      pcVar2 = local_20;
      if (bVar3) {
        if (local_a0 < 0) {
          pcVar7 = std::optional<cmList>::operator->((optional<cmList> *)local_88);
          sVar8 = cmList::size(pcVar7);
          local_110 = sVar8 - 1;
          cmStrCat<char_const(&)[14],int&,char_const(&)[22],unsigned_long>
                    (&local_108,(char (*) [14])"begin index: ",&local_a0,
                     (char (*) [22])" is out of range 0 - ",&local_110);
          cmExecutionStatus::SetError(pcVar2,&local_108);
          std::__cxx11::string::~string((string *)&local_108);
          args_local._7_1_ = 0;
          length = 1;
        }
        else if (local_a4 < -1) {
          cmStrCat<char_const(&)[9],int&,char_const(&)[25]>
                    ((string *)
                     &sublist.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [9])"length: ",
                     &local_a4,(char (*) [25])" should be -1 or greater");
          cmExecutionStatus::SetError
                    (pcVar2,(string *)
                            &sublist.Values.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string
                    ((string *)
                     &sublist.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          args_local._7_1_ = 0;
          length = 1;
        }
        else {
          pcVar7 = std::optional<cmList>::operator->((optional<cmList> *)local_88);
          cmList::sublist((cmList *)local_148,pcVar7,(long)local_a0,(long)local_a4);
          pcVar6 = cmExecutionStatus::GetMakefile(local_20);
          uVar1 = list.super__Optional_base<cmList,_false,_false>._M_payload.
                  super__Optional_payload<cmList,_true,_false,_false>.
                  super__Optional_payload_base<cmList>._24_8_;
          cmList::to_string_abi_cxx11_((string *)&e,(cmList *)local_148);
          local_158 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)&e);
          cmMakefile::AddDefinition(pcVar6,(string *)uVar1,local_158);
          std::__cxx11::string::~string((string *)&e);
          args_local._7_1_ = 1;
          length = 1;
          cmList::~cmList((cmList *)local_148);
        }
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,3);
        cmStrCat<char_const(&)[8],std::__cxx11::string_const&,char_const(&)[22]>
                  (&local_e8,(char (*) [8])0x103d714,pvVar5,(char (*) [22])0x1082972);
        cmExecutionStatus::SetError(pcVar2,&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        args_local._7_1_ = 0;
        length = 1;
      }
    }
    else {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,2);
      cmStrCat<char_const(&)[8],std::__cxx11::string_const&,char_const(&)[22]>
                (&local_c8,(char (*) [8])0x103d714,pvVar5,(char (*) [22])0x1082972);
      cmExecutionStatus::SetError(pcVar2,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      args_local._7_1_ = 0;
      length = 1;
    }
  }
  else {
LAB_0062eb1c:
    pcVar6 = cmExecutionStatus::GetMakefile(local_20);
    uVar1 = list.super__Optional_base<cmList,_false,_false>._M_payload.
            super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>
            ._24_8_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&start,"");
    cmMakefile::AddDefinition(pcVar6,(string *)uVar1,_start);
    args_local._7_1_ = 1;
    length = 1;
  }
  std::optional<cmList>::~optional((optional<cmList> *)local_88);
LAB_0062f077:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleSublistCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() != 5) {
    status.SetError(cmStrCat("sub-command SUBLIST requires four arguments (",
                             args.size() - 1, " found)."));
    return false;
  }

  const std::string& listName = args[1];
  const std::string& variableName = args.back();

  // expand the variable
  auto list = GetList(listName, status.GetMakefile());

  if (!list || list->empty()) {
    status.GetMakefile().AddDefinition(variableName, "");
    return true;
  }

  int start;
  int length;
  if (!GetIndexArg(args[2], &start, status.GetMakefile())) {
    status.SetError(cmStrCat("index: ", args[2], " is not a valid index"));
    return false;
  }
  if (!GetIndexArg(args[3], &length, status.GetMakefile())) {
    status.SetError(cmStrCat("index: ", args[3], " is not a valid index"));
    return false;
  }

  if (start < 0) {
    status.SetError(cmStrCat("begin index: ", start, " is out of range 0 - ",
                             list->size() - 1));
    return false;
  }
  if (length < -1) {
    status.SetError(cmStrCat("length: ", length, " should be -1 or greater"));
    return false;
  }

  using size_type = cmList::size_type;

  try {
    auto sublist = list->sublist(static_cast<size_type>(start),
                                 static_cast<size_type>(length));
    status.GetMakefile().AddDefinition(variableName, sublist.to_string());
    return true;
  } catch (std::out_of_range& e) {
    status.SetError(e.what());
    return false;
  }
}